

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

key_components * opensshcert_components(ssh_key *key)

{
  key_component *pkVar1;
  key_components *kc_00;
  strbuf *psVar2;
  ssh_key *key_00;
  key_components *kc_01;
  char *name;
  ptrlen pVar3;
  char *subname;
  key_component *comp;
  size_t i;
  key_components *kc_ca_key;
  ssh_key *ca_key;
  ptrlen ca_algname;
  strbuf *date_1;
  strbuf *date;
  key_components *kc;
  opensshcert_key *ck;
  ssh_key *key_local;
  
  kc_00 = ssh_key_components((ssh_key *)key[-1].vt);
  pVar3 = ptrlen_from_strbuf(((opensshcert_key *)(key + -0xd))->nonce);
  key_components_add_binary(kc_00,"cert_nonce",pVar3);
  key_components_add_uint(kc_00,"cert_serial",(uintmax_t)key[-0xc].vt);
  if (*(int *)&key[-0xb].vt == 1) {
    key_components_add_text(kc_00,"cert_type","user");
  }
  else if (*(int *)&key[-0xb].vt == 2) {
    key_components_add_text(kc_00,"cert_type","host");
  }
  else {
    key_components_add_uint(kc_00,"cert_type",(ulong)*(uint *)&key[-0xb].vt);
  }
  key_components_add_text(kc_00,"cert_key_id",(char *)(key[-10].vt)->new_pub);
  opensshcert_string_list_key_components
            (kc_00,(strbuf *)key[-9].vt,"cert_valid_principal",(char *)0x0);
  key_components_add_uint(kc_00,"cert_valid_after",(uintmax_t)key[-8].vt);
  key_components_add_uint(kc_00,"cert_valid_before",(uintmax_t)key[-7].vt);
  if (key[-8].vt != (ssh_keyalg *)0x0) {
    psVar2 = strbuf_new();
    opensshcert_time_to_iso8601(psVar2->binarysink_,(uint64_t)key[-8].vt);
    pVar3 = ptrlen_from_strbuf(psVar2);
    key_components_add_text_pl(kc_00,"cert_valid_after_date",pVar3);
    strbuf_free(psVar2);
  }
  if (key[-7].vt != (ssh_keyalg *)0xffffffffffffffff) {
    psVar2 = strbuf_new();
    opensshcert_time_to_iso8601(psVar2->binarysink_,(uint64_t)key[-7].vt);
    pVar3 = ptrlen_from_strbuf(psVar2);
    key_components_add_text_pl(kc_00,"cert_valid_before_date",pVar3);
    strbuf_free(psVar2);
  }
  opensshcert_string_list_key_components
            (kc_00,(strbuf *)key[-6].vt,"cert_critical_option","cert_critical_option_data");
  opensshcert_string_list_key_components
            (kc_00,(strbuf *)key[-5].vt,"cert_extension","cert_extension_data");
  join_0x00000010_0x00000000_ = ptrlen_from_strbuf((strbuf *)key[-3].vt);
  key_components_add_binary(kc_00,"cert_ca_key",join_0x00000010_0x00000000_);
  pVar3 = make_ptrlen((void *)0x0,0);
  key_00 = opensshcert_ca_pub_key((opensshcert_key *)(key + -0xd),pVar3,(ptrlen *)&ca_key);
  key_components_add_text_pl(kc_00,"cert_ca_key_algorithm_id",_ca_key);
  if (key_00 != (ssh_key *)0x0) {
    kc_01 = ssh_key_components(key_00);
    for (comp = (key_component *)0x0; comp < (key_component *)kc_01->ncomponents;
        comp = (key_component *)((long)&comp->name + 1)) {
      pkVar1 = kc_01->components;
      name = dupcat_fn("cert_ca_key_",pkVar1[(long)comp].name,0);
      key_components_add_copy(kc_00,name,pkVar1 + (long)comp);
      safefree(name);
    }
    key_components_free(kc_01);
    ssh_key_free(key_00);
  }
  pVar3 = ptrlen_from_strbuf((strbuf *)key[-2].vt);
  key_components_add_binary(kc_00,"cert_ca_sig",pVar3);
  return kc_00;
}

Assistant:

static key_components *opensshcert_components(ssh_key *key)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    key_components *kc = ssh_key_components(ck->basekey);
    key_components_add_binary(kc, "cert_nonce", ptrlen_from_strbuf(ck->nonce));
    key_components_add_uint(kc, "cert_serial", ck->serial);
    switch (ck->type) {
      case SSH_CERT_TYPE_HOST:
        key_components_add_text(kc, "cert_type", "host");
        break;
      case SSH_CERT_TYPE_USER:
        key_components_add_text(kc, "cert_type", "user");
        break;
      default:
        key_components_add_uint(kc, "cert_type", ck->type);
        break;
    }
    key_components_add_text(kc, "cert_key_id", ck->key_id->s);
    opensshcert_string_list_key_components(kc, ck->valid_principals,
                                           "cert_valid_principal", NULL);
    key_components_add_uint(kc, "cert_valid_after", ck->valid_after);
    key_components_add_uint(kc, "cert_valid_before", ck->valid_before);
    /* Translate the validity period into human-legible dates, but
     * only if they're not the min/max integer. Rationale: if you see
     * "584554051223-11-09 07:00:15 UTC" as the expiry time you'll be
     * as likely to think it's a weird buffer overflow as half a
     * trillion years in the future! */
    if (ck->valid_after != 0) {
        strbuf *date = strbuf_new();
        opensshcert_time_to_iso8601(BinarySink_UPCAST(date), ck->valid_after);
        key_components_add_text_pl(kc, "cert_valid_after_date",
                                   ptrlen_from_strbuf(date));
        strbuf_free(date);
    }
    if (ck->valid_before != 0xFFFFFFFFFFFFFFFF) {
        strbuf *date = strbuf_new();
        opensshcert_time_to_iso8601(BinarySink_UPCAST(date), ck->valid_before);
        key_components_add_text_pl(kc, "cert_valid_before_date",
                                   ptrlen_from_strbuf(date));
        strbuf_free(date);
    }
    opensshcert_string_list_key_components(kc, ck->critical_options,
                                           "cert_critical_option",
                                           "cert_critical_option_data");
    opensshcert_string_list_key_components(kc, ck->extensions,
                                           "cert_extension",
                                           "cert_extension_data");
    key_components_add_binary(kc, "cert_ca_key", ptrlen_from_strbuf(
                                  ck->signature_key));

    ptrlen ca_algname;
    ssh_key *ca_key = opensshcert_ca_pub_key(ck, make_ptrlen(NULL, 0),
                                             &ca_algname);
    key_components_add_text_pl(kc, "cert_ca_key_algorithm_id", ca_algname);

    if (ca_key) {
        key_components *kc_ca_key = ssh_key_components(ca_key);
        for (size_t i = 0; i < kc_ca_key->ncomponents; i++) {
            key_component *comp = &kc_ca_key->components[i];
            char *subname = dupcat("cert_ca_key_", comp->name);
            key_components_add_copy(kc, subname, comp);
            sfree(subname);
        }
        key_components_free(kc_ca_key);
        ssh_key_free(ca_key);
    }

    key_components_add_binary(kc, "cert_ca_sig", ptrlen_from_strbuf(
                                  ck->signature));
    return kc;
}